

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.c
# Opt level: O0

size_t Curl_hash_str(void *key,size_t key_length,size_t slots_num)

{
  size_t j;
  size_t h;
  char *end;
  char *key_str;
  size_t slots_num_local;
  size_t key_length_local;
  void *key_local;
  
  j = 0x1505;
  for (end = (char *)key; end < (char *)((long)key + key_length); end = end + 1) {
    j = (long)*end ^ j * 0x21;
  }
  return j % slots_num;
}

Assistant:

size_t Curl_hash_str(void *key, size_t key_length, size_t slots_num)
{
  const char *key_str = (const char *) key;
  const char *end = key_str + key_length;
  size_t h = 5381;

  while(key_str < end) {
    size_t j = (size_t)*key_str++;
    h += h << 5;
    h ^= j;
  }

  return (h % slots_num);
}